

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

void * __thiscall
google::protobuf::Arena::AllocateAlignedForArray(Arena *this,size_t n,size_t align)

{
  void *pvVar1;
  size_t n_00;
  ArenaAlign align_as;
  ArenaAlign local_20;
  
  if (align < 9) {
    pvVar1 = AllocateForArray(this,n + 7 & 0xfffffffffffffff8);
    return pvVar1;
  }
  local_20 = internal::ArenaAlignAs(align);
  n_00 = internal::ArenaAlign::Padded(&local_20,n);
  pvVar1 = AllocateForArray(this,n_00);
  return (void *)(-local_20.align & (long)pvVar1 + (local_20.align - 1));
}

Assistant:

void* PROTOBUF_NONNULL AllocateAlignedForArray(size_t n, size_t align) {
    if (align <= internal::ArenaAlignDefault::align) {
      return AllocateForArray(internal::ArenaAlignDefault::Ceil(n));
    } else {
      // We are wasting space by over allocating align - 8 bytes. Compared
      // to a dedicated function that takes current alignment in consideration.
      // Such a scheme would only waste (align - 8)/2 bytes on average, but
      // requires a dedicated function in the outline arena allocation
      // functions. Possibly re-evaluate tradeoffs later.
      auto align_as = internal::ArenaAlignAs(align);
      return align_as.Ceil(AllocateForArray(align_as.Padded(n)));
    }
  }